

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_SubDMeshFragment ** __thiscall
ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCapacity
          (ON_SimpleArray<const_ON_SubDMeshFragment_*> *this,size_t new_capacity)

{
  undefined8 uVar1;
  int local_2c;
  int capacity;
  size_t new_capacity_local;
  ON_SimpleArray<const_ON_SubDMeshFragment_*> *this_local;
  
  if (*(int *)(this + 0x14) == 0) {
    *(undefined8 *)(this + 8) = 0;
    *(undefined4 *)(this + 0x10) = 0;
  }
  if ((new_capacity == 0) || (0xfffffffe < new_capacity)) {
    local_2c = 0;
  }
  else {
    local_2c = (int)new_capacity;
  }
  if (local_2c != *(int *)(this + 0x14)) {
    if (local_2c < 1) {
      if (*(long *)(this + 8) != 0) {
        (**(code **)(*(long *)this + 0x18))(this,*(undefined8 *)(this + 8),0);
        *(undefined8 *)(this + 8) = 0;
        *(undefined4 *)(this + 0x14) = 0;
        *(undefined4 *)(this + 0x10) = 0;
      }
    }
    else {
      if (local_2c < *(int *)(this + 0x10)) {
        *(int *)(this + 0x10) = local_2c;
      }
      uVar1 = (**(code **)(*(long *)this + 0x18))(this,*(undefined8 *)(this + 8),local_2c);
      *(undefined8 *)(this + 8) = uVar1;
      if (*(long *)(this + 8) == 0) {
        *(undefined4 *)(this + 0x14) = 0;
        *(undefined4 *)(this + 0x10) = 0;
      }
      else {
        if (*(int *)(this + 0x14) < local_2c) {
          memset((void *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 8),0,
                 (long)(local_2c - *(int *)(this + 0x14)) << 3);
        }
        *(int *)(this + 0x14) = local_2c;
      }
    }
  }
  return *(ON_SubDMeshFragment ***)(this + 8);
}

Assistant:

T* ON_SimpleArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }

  // sets capacity to input value
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX) 
               ? (int)new_capacity 
               : 0;
  if ( capacity != m_capacity ) {
    if( capacity > 0 ) {
      if ( m_count > capacity )
        m_count = capacity;
      // NOTE: Realloc() does an allocation if the first argument is nullptr.
      m_a = Realloc( m_a, capacity );
      if ( m_a ) {
        if ( capacity > m_capacity ) {
          // zero new memory
          memset( (void*) (m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
        }
        m_capacity = capacity;
      }
      else {
        // out of memory
        m_count = m_capacity = 0;
      }
    }
    else if (m_a) {
      Realloc(m_a,0);
      m_a = 0;
      m_count = m_capacity = 0;
    }
  }
  return m_a;
}